

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_control_flow.cpp
# Opt level: O2

void hierarchical_condition(uint w)

{
  Node *pNVar1;
  Node *pNVar2;
  Node *pNVar3;
  Task this;
  FlowBuilder FVar4;
  FlowBuilder FVar5;
  pointer pcVar6;
  long *plVar7;
  string local_560;
  Task init;
  Task sbf1;
  allocator<char> local_529;
  Task mod2;
  int c2;
  Task mod0;
  Task loop1;
  Task sync;
  int c2_repeat;
  FlowBuilder local_4f8;
  Task loop2;
  int c1;
  shared_ptr<tf::WorkerInterface> local_4d8;
  Taskflow tf3;
  Future<void> local_400;
  Future<void> local_3e0;
  Taskflow tf2;
  Taskflow tf1;
  Taskflow tf0;
  Executor executor;
  
  local_4d8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_4d8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)w,&local_4d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_4d8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tf1,"c0",(allocator<char> *)&tf2);
  tf::Taskflow::Taskflow(&tf0,(string *)&tf1);
  std::__cxx11::string::~string((string *)&tf1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tf2,"c1",(allocator<char> *)&tf3);
  tf::Taskflow::Taskflow(&tf1,(string *)&tf2);
  std::__cxx11::string::~string((string *)&tf2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tf3,"c2",(allocator<char> *)&local_560);
  tf::Taskflow::Taskflow(&tf2,(string *)&tf3);
  std::__cxx11::string::~string((string *)&tf3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"top",(allocator<char> *)&init);
  tf::Taskflow::Taskflow(&tf3,&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  FVar4 = tf1.super_FlowBuilder;
  local_560._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_560._M_dataplus._M_p[0] = '\0';
  local_560._M_dataplus._M_p[1] = '\0';
  local_560._M_dataplus._M_p[2] = '\0';
  local_560._M_dataplus._M_p[3] = '\0';
  local_560._M_dataplus._M_p[4] = '\0';
  local_560._M_dataplus._M_p[5] = '\0';
  local_560._M_dataplus._M_p[6] = '\0';
  local_560._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 8) = local_560._M_dataplus._M_p + 0x18;
  local_560._M_dataplus._M_p[0x10] = '\0';
  local_560._M_dataplus._M_p[0x11] = '\0';
  local_560._M_dataplus._M_p[0x12] = '\0';
  local_560._M_dataplus._M_p[0x13] = '\0';
  local_560._M_dataplus._M_p[0x14] = '\0';
  local_560._M_dataplus._M_p[0x15] = '\0';
  local_560._M_dataplus._M_p[0x16] = '\0';
  local_560._M_dataplus._M_p[0x17] = '\0';
  local_560._M_dataplus._M_p[0x18] = '\0';
  local_560._M_dataplus._M_p[0x28] = '\0';
  local_560._M_dataplus._M_p[0x29] = '\0';
  local_560._M_dataplus._M_p[0x2a] = '\0';
  local_560._M_dataplus._M_p[0x2b] = '\0';
  local_560._M_dataplus._M_p[0x2c] = '\0';
  local_560._M_dataplus._M_p[0x2d] = '\0';
  local_560._M_dataplus._M_p[0x2e] = '\0';
  local_560._M_dataplus._M_p[0x2f] = '\0';
  local_560._M_dataplus._M_p[0x30] = '\0';
  local_560._M_dataplus._M_p[0x31] = '\0';
  local_560._M_dataplus._M_p[0x32] = '\0';
  local_560._M_dataplus._M_p[0x33] = '\0';
  local_560._M_dataplus._M_p[0x34] = '\0';
  local_560._M_dataplus._M_p[0x35] = '\0';
  local_560._M_dataplus._M_p[0x36] = '\0';
  local_560._M_dataplus._M_p[0x37] = '\0';
  local_560._M_dataplus._M_p[0x38] = '\0';
  local_560._M_dataplus._M_p[0x39] = '\0';
  local_560._M_dataplus._M_p[0x3a] = '\0';
  local_560._M_dataplus._M_p[0x3b] = '\0';
  local_560._M_dataplus._M_p[0x3c] = '\0';
  local_560._M_dataplus._M_p[0x3d] = '\0';
  local_560._M_dataplus._M_p[0x3e] = '\0';
  local_560._M_dataplus._M_p[0x3f] = '\0';
  local_560._M_dataplus._M_p[0x40] = '\0';
  local_560._M_dataplus._M_p[0x41] = '\0';
  local_560._M_dataplus._M_p[0x42] = '\0';
  local_560._M_dataplus._M_p[0x43] = '\0';
  local_560._M_dataplus._M_p[0x44] = '\0';
  local_560._M_dataplus._M_p[0x45] = '\0';
  local_560._M_dataplus._M_p[0x46] = '\0';
  local_560._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 0x48) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x50) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x58) = local_560._M_dataplus._M_p + 0x80;
  local_560._M_dataplus._M_p[0x80] = '\0';
  local_560._M_dataplus._M_p[0x81] = '\0';
  local_560._M_dataplus._M_p[0x82] = '\0';
  local_560._M_dataplus._M_p[0x83] = '\0';
  local_560._M_dataplus._M_p[0x84] = '\0';
  local_560._M_dataplus._M_p[0x85] = '\0';
  local_560._M_dataplus._M_p[0x86] = '\0';
  local_560._M_dataplus._M_p[0x87] = '\0';
  local_560._M_dataplus._M_p[0x90] = '\0';
  local_560._M_dataplus._M_p[0x91] = '\0';
  local_560._M_dataplus._M_p[0x92] = '\0';
  local_560._M_dataplus._M_p[0x93] = '\0';
  local_560._M_dataplus._M_p[0x94] = '\0';
  local_560._M_dataplus._M_p[0x95] = '\0';
  local_560._M_dataplus._M_p[0x96] = '\0';
  local_560._M_dataplus._M_p[0x97] = '\0';
  *(int **)(local_560._M_dataplus._M_p + 0x88) = &c1;
  *(code **)(local_560._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:538:27)>
       ::_M_invoke;
  *(code **)(local_560._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:538:27)>
       ::_M_manager;
  local_560._M_dataplus._M_p[0xc0] = '\x01';
  local_560._M_dataplus._M_p[200] = '\0';
  local_560._M_dataplus._M_p[0xc9] = '\0';
  local_560._M_dataplus._M_p[0xca] = '\0';
  local_560._M_dataplus._M_p[0xcb] = '\0';
  local_560._M_dataplus._M_p[0xcc] = '\0';
  local_560._M_dataplus._M_p[0xcd] = '\0';
  local_560._M_dataplus._M_p[0xce] = '\0';
  local_560._M_dataplus._M_p[0xcf] = '\0';
  local_560._M_dataplus._M_p[0xd0] = '\0';
  local_560._M_dataplus._M_p[0xd1] = '\0';
  local_560._M_dataplus._M_p[0xd2] = '\0';
  local_560._M_dataplus._M_p[0xd3] = '\0';
  local_560._M_dataplus._M_p[0xd4] = '\0';
  local_560._M_dataplus._M_p[0xd5] = '\0';
  local_560._M_dataplus._M_p[0xd6] = '\0';
  local_560._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar4._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  FVar5 = tf1.super_FlowBuilder;
  pNVar1 = ((FVar4._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_560._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_560._M_dataplus._M_p[0] = '\0';
  local_560._M_dataplus._M_p[1] = '\0';
  local_560._M_dataplus._M_p[2] = '\0';
  local_560._M_dataplus._M_p[3] = '\0';
  local_560._M_dataplus._M_p[4] = '\0';
  local_560._M_dataplus._M_p[5] = '\0';
  local_560._M_dataplus._M_p[6] = '\0';
  local_560._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 8) = local_560._M_dataplus._M_p + 0x18;
  local_560._M_dataplus._M_p[0x10] = '\0';
  local_560._M_dataplus._M_p[0x11] = '\0';
  local_560._M_dataplus._M_p[0x12] = '\0';
  local_560._M_dataplus._M_p[0x13] = '\0';
  local_560._M_dataplus._M_p[0x14] = '\0';
  local_560._M_dataplus._M_p[0x15] = '\0';
  local_560._M_dataplus._M_p[0x16] = '\0';
  local_560._M_dataplus._M_p[0x17] = '\0';
  local_560._M_dataplus._M_p[0x18] = '\0';
  local_560._M_dataplus._M_p[0x28] = '\0';
  local_560._M_dataplus._M_p[0x29] = '\0';
  local_560._M_dataplus._M_p[0x2a] = '\0';
  local_560._M_dataplus._M_p[0x2b] = '\0';
  local_560._M_dataplus._M_p[0x2c] = '\0';
  local_560._M_dataplus._M_p[0x2d] = '\0';
  local_560._M_dataplus._M_p[0x2e] = '\0';
  local_560._M_dataplus._M_p[0x2f] = '\0';
  local_560._M_dataplus._M_p[0x30] = '\0';
  local_560._M_dataplus._M_p[0x31] = '\0';
  local_560._M_dataplus._M_p[0x32] = '\0';
  local_560._M_dataplus._M_p[0x33] = '\0';
  local_560._M_dataplus._M_p[0x34] = '\0';
  local_560._M_dataplus._M_p[0x35] = '\0';
  local_560._M_dataplus._M_p[0x36] = '\0';
  local_560._M_dataplus._M_p[0x37] = '\0';
  local_560._M_dataplus._M_p[0x38] = '\0';
  local_560._M_dataplus._M_p[0x39] = '\0';
  local_560._M_dataplus._M_p[0x3a] = '\0';
  local_560._M_dataplus._M_p[0x3b] = '\0';
  local_560._M_dataplus._M_p[0x3c] = '\0';
  local_560._M_dataplus._M_p[0x3d] = '\0';
  local_560._M_dataplus._M_p[0x3e] = '\0';
  local_560._M_dataplus._M_p[0x3f] = '\0';
  local_560._M_dataplus._M_p[0x40] = '\0';
  local_560._M_dataplus._M_p[0x41] = '\0';
  local_560._M_dataplus._M_p[0x42] = '\0';
  local_560._M_dataplus._M_p[0x43] = '\0';
  local_560._M_dataplus._M_p[0x44] = '\0';
  local_560._M_dataplus._M_p[0x45] = '\0';
  local_560._M_dataplus._M_p[0x46] = '\0';
  local_560._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 0x48) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x50) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x58) = local_560._M_dataplus._M_p + 0x80;
  local_560._M_dataplus._M_p[0x80] = '\0';
  local_560._M_dataplus._M_p[0x81] = '\0';
  local_560._M_dataplus._M_p[0x82] = '\0';
  local_560._M_dataplus._M_p[0x83] = '\0';
  local_560._M_dataplus._M_p[0x84] = '\0';
  local_560._M_dataplus._M_p[0x85] = '\0';
  local_560._M_dataplus._M_p[0x86] = '\0';
  local_560._M_dataplus._M_p[0x87] = '\0';
  local_560._M_dataplus._M_p[0x88] = '\0';
  local_560._M_dataplus._M_p[0x89] = '\0';
  local_560._M_dataplus._M_p[0x8a] = '\0';
  local_560._M_dataplus._M_p[0x8b] = '\0';
  *(int **)(local_560._M_dataplus._M_p + 0x90) = &c1;
  *(code **)(local_560._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:539:27)>
       ::_M_invoke;
  *(code **)(local_560._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:539:27)>
       ::_M_manager;
  local_560._M_dataplus._M_p[0xc0] = '\x01';
  local_560._M_dataplus._M_p[200] = '\0';
  local_560._M_dataplus._M_p[0xc9] = '\0';
  local_560._M_dataplus._M_p[0xca] = '\0';
  local_560._M_dataplus._M_p[0xcb] = '\0';
  local_560._M_dataplus._M_p[0xcc] = '\0';
  local_560._M_dataplus._M_p[0xcd] = '\0';
  local_560._M_dataplus._M_p[0xce] = '\0';
  local_560._M_dataplus._M_p[0xcf] = '\0';
  local_560._M_dataplus._M_p[0xd0] = '\0';
  local_560._M_dataplus._M_p[0xd1] = '\0';
  local_560._M_dataplus._M_p[0xd2] = '\0';
  local_560._M_dataplus._M_p[0xd3] = '\0';
  local_560._M_dataplus._M_p[0xd4] = '\0';
  local_560._M_dataplus._M_p[0xd5] = '\0';
  local_560._M_dataplus._M_p[0xd6] = '\0';
  local_560._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar5._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  pNVar2 = ((FVar5._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_560._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_560._M_dataplus._M_p[0] = '\0';
  local_560._M_dataplus._M_p[1] = '\0';
  local_560._M_dataplus._M_p[2] = '\0';
  local_560._M_dataplus._M_p[3] = '\0';
  local_560._M_dataplus._M_p[4] = '\0';
  local_560._M_dataplus._M_p[5] = '\0';
  local_560._M_dataplus._M_p[6] = '\0';
  local_560._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 8) = local_560._M_dataplus._M_p + 0x18;
  local_560._M_dataplus._M_p[0x10] = '\0';
  local_560._M_dataplus._M_p[0x11] = '\0';
  local_560._M_dataplus._M_p[0x12] = '\0';
  local_560._M_dataplus._M_p[0x13] = '\0';
  local_560._M_dataplus._M_p[0x14] = '\0';
  local_560._M_dataplus._M_p[0x15] = '\0';
  local_560._M_dataplus._M_p[0x16] = '\0';
  local_560._M_dataplus._M_p[0x17] = '\0';
  local_560._M_dataplus._M_p[0x18] = '\0';
  local_560._M_dataplus._M_p[0x28] = '\0';
  local_560._M_dataplus._M_p[0x29] = '\0';
  local_560._M_dataplus._M_p[0x2a] = '\0';
  local_560._M_dataplus._M_p[0x2b] = '\0';
  local_560._M_dataplus._M_p[0x2c] = '\0';
  local_560._M_dataplus._M_p[0x2d] = '\0';
  local_560._M_dataplus._M_p[0x2e] = '\0';
  local_560._M_dataplus._M_p[0x2f] = '\0';
  local_560._M_dataplus._M_p[0x30] = '\0';
  local_560._M_dataplus._M_p[0x31] = '\0';
  local_560._M_dataplus._M_p[0x32] = '\0';
  local_560._M_dataplus._M_p[0x33] = '\0';
  local_560._M_dataplus._M_p[0x34] = '\0';
  local_560._M_dataplus._M_p[0x35] = '\0';
  local_560._M_dataplus._M_p[0x36] = '\0';
  local_560._M_dataplus._M_p[0x37] = '\0';
  local_560._M_dataplus._M_p[0x38] = '\0';
  local_560._M_dataplus._M_p[0x39] = '\0';
  local_560._M_dataplus._M_p[0x3a] = '\0';
  local_560._M_dataplus._M_p[0x3b] = '\0';
  local_560._M_dataplus._M_p[0x3c] = '\0';
  local_560._M_dataplus._M_p[0x3d] = '\0';
  local_560._M_dataplus._M_p[0x3e] = '\0';
  local_560._M_dataplus._M_p[0x3f] = '\0';
  local_560._M_dataplus._M_p[0x40] = '\0';
  local_560._M_dataplus._M_p[0x41] = '\0';
  local_560._M_dataplus._M_p[0x42] = '\0';
  local_560._M_dataplus._M_p[0x43] = '\0';
  local_560._M_dataplus._M_p[0x44] = '\0';
  local_560._M_dataplus._M_p[0x45] = '\0';
  local_560._M_dataplus._M_p[0x46] = '\0';
  local_560._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 0x48) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x50) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x58) = local_560._M_dataplus._M_p + 0x80;
  local_560._M_dataplus._M_p[0x80] = '\0';
  local_560._M_dataplus._M_p[0x81] = '\0';
  local_560._M_dataplus._M_p[0x82] = '\0';
  local_560._M_dataplus._M_p[0x83] = '\0';
  local_560._M_dataplus._M_p[0x84] = '\0';
  local_560._M_dataplus._M_p[0x85] = '\0';
  local_560._M_dataplus._M_p[0x86] = '\0';
  local_560._M_dataplus._M_p[0x87] = '\0';
  local_560._M_dataplus._M_p[0x90] = '\0';
  local_560._M_dataplus._M_p[0x91] = '\0';
  local_560._M_dataplus._M_p[0x92] = '\0';
  local_560._M_dataplus._M_p[0x93] = '\0';
  local_560._M_dataplus._M_p[0x94] = '\0';
  local_560._M_dataplus._M_p[0x95] = '\0';
  local_560._M_dataplus._M_p[0x96] = '\0';
  local_560._M_dataplus._M_p[0x97] = '\0';
  *(int **)(local_560._M_dataplus._M_p + 0x88) = &c1;
  *(code **)(local_560._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:542:27)>
       ::_M_invoke;
  *(code **)(local_560._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:542:27)>
       ::_M_manager;
  local_560._M_dataplus._M_p[0xc0] = '\x04';
  local_560._M_dataplus._M_p[200] = '\0';
  local_560._M_dataplus._M_p[0xc9] = '\0';
  local_560._M_dataplus._M_p[0xca] = '\0';
  local_560._M_dataplus._M_p[0xcb] = '\0';
  local_560._M_dataplus._M_p[0xcc] = '\0';
  local_560._M_dataplus._M_p[0xcd] = '\0';
  local_560._M_dataplus._M_p[0xce] = '\0';
  local_560._M_dataplus._M_p[0xcf] = '\0';
  local_560._M_dataplus._M_p[0xd0] = '\0';
  local_560._M_dataplus._M_p[0xd1] = '\0';
  local_560._M_dataplus._M_p[0xd2] = '\0';
  local_560._M_dataplus._M_p[0xd3] = '\0';
  local_560._M_dataplus._M_p[0xd4] = '\0';
  local_560._M_dataplus._M_p[0xd5] = '\0';
  local_560._M_dataplus._M_p[0xd6] = '\0';
  local_560._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)tf1.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  pNVar3 = ((tf1.super_FlowBuilder._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  tf::Node::_precede(pNVar1,pNVar2);
  tf::Node::_precede(pNVar2,pNVar3);
  tf::Node::_precede(pNVar3,pNVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"c1A",(allocator<char> *)&init);
  std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"c1B",(allocator<char> *)&init);
  std::__cxx11::string::_M_assign((string *)&pNVar2->_name);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"c1C",(allocator<char> *)&init);
  std::__cxx11::string::_M_assign((string *)&pNVar3->_name);
  std::__cxx11::string::~string((string *)&local_560);
  FVar4 = tf2.super_FlowBuilder;
  local_560._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_560._M_dataplus._M_p[0] = '\0';
  local_560._M_dataplus._M_p[1] = '\0';
  local_560._M_dataplus._M_p[2] = '\0';
  local_560._M_dataplus._M_p[3] = '\0';
  local_560._M_dataplus._M_p[4] = '\0';
  local_560._M_dataplus._M_p[5] = '\0';
  local_560._M_dataplus._M_p[6] = '\0';
  local_560._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 8) = local_560._M_dataplus._M_p + 0x18;
  local_560._M_dataplus._M_p[0x10] = '\0';
  local_560._M_dataplus._M_p[0x11] = '\0';
  local_560._M_dataplus._M_p[0x12] = '\0';
  local_560._M_dataplus._M_p[0x13] = '\0';
  local_560._M_dataplus._M_p[0x14] = '\0';
  local_560._M_dataplus._M_p[0x15] = '\0';
  local_560._M_dataplus._M_p[0x16] = '\0';
  local_560._M_dataplus._M_p[0x17] = '\0';
  local_560._M_dataplus._M_p[0x18] = '\0';
  local_560._M_dataplus._M_p[0x28] = '\0';
  local_560._M_dataplus._M_p[0x29] = '\0';
  local_560._M_dataplus._M_p[0x2a] = '\0';
  local_560._M_dataplus._M_p[0x2b] = '\0';
  local_560._M_dataplus._M_p[0x2c] = '\0';
  local_560._M_dataplus._M_p[0x2d] = '\0';
  local_560._M_dataplus._M_p[0x2e] = '\0';
  local_560._M_dataplus._M_p[0x2f] = '\0';
  local_560._M_dataplus._M_p[0x30] = '\0';
  local_560._M_dataplus._M_p[0x31] = '\0';
  local_560._M_dataplus._M_p[0x32] = '\0';
  local_560._M_dataplus._M_p[0x33] = '\0';
  local_560._M_dataplus._M_p[0x34] = '\0';
  local_560._M_dataplus._M_p[0x35] = '\0';
  local_560._M_dataplus._M_p[0x36] = '\0';
  local_560._M_dataplus._M_p[0x37] = '\0';
  local_560._M_dataplus._M_p[0x38] = '\0';
  local_560._M_dataplus._M_p[0x39] = '\0';
  local_560._M_dataplus._M_p[0x3a] = '\0';
  local_560._M_dataplus._M_p[0x3b] = '\0';
  local_560._M_dataplus._M_p[0x3c] = '\0';
  local_560._M_dataplus._M_p[0x3d] = '\0';
  local_560._M_dataplus._M_p[0x3e] = '\0';
  local_560._M_dataplus._M_p[0x3f] = '\0';
  local_560._M_dataplus._M_p[0x40] = '\0';
  local_560._M_dataplus._M_p[0x41] = '\0';
  local_560._M_dataplus._M_p[0x42] = '\0';
  local_560._M_dataplus._M_p[0x43] = '\0';
  local_560._M_dataplus._M_p[0x44] = '\0';
  local_560._M_dataplus._M_p[0x45] = '\0';
  local_560._M_dataplus._M_p[0x46] = '\0';
  local_560._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 0x48) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x50) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x58) = local_560._M_dataplus._M_p + 0x80;
  local_560._M_dataplus._M_p[0x80] = '\0';
  local_560._M_dataplus._M_p[0x81] = '\0';
  local_560._M_dataplus._M_p[0x82] = '\0';
  local_560._M_dataplus._M_p[0x83] = '\0';
  local_560._M_dataplus._M_p[0x84] = '\0';
  local_560._M_dataplus._M_p[0x85] = '\0';
  local_560._M_dataplus._M_p[0x86] = '\0';
  local_560._M_dataplus._M_p[0x87] = '\0';
  local_560._M_dataplus._M_p[0x90] = '\0';
  local_560._M_dataplus._M_p[0x91] = '\0';
  local_560._M_dataplus._M_p[0x92] = '\0';
  local_560._M_dataplus._M_p[0x93] = '\0';
  local_560._M_dataplus._M_p[0x94] = '\0';
  local_560._M_dataplus._M_p[0x95] = '\0';
  local_560._M_dataplus._M_p[0x96] = '\0';
  local_560._M_dataplus._M_p[0x97] = '\0';
  *(int **)(local_560._M_dataplus._M_p + 0x88) = &c2;
  *(code **)(local_560._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:551:27)>
       ::_M_invoke;
  *(code **)(local_560._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:551:27)>
       ::_M_manager;
  local_560._M_dataplus._M_p[0xc0] = '\x01';
  local_560._M_dataplus._M_p[200] = '\0';
  local_560._M_dataplus._M_p[0xc9] = '\0';
  local_560._M_dataplus._M_p[0xca] = '\0';
  local_560._M_dataplus._M_p[0xcb] = '\0';
  local_560._M_dataplus._M_p[0xcc] = '\0';
  local_560._M_dataplus._M_p[0xcd] = '\0';
  local_560._M_dataplus._M_p[0xce] = '\0';
  local_560._M_dataplus._M_p[0xcf] = '\0';
  local_560._M_dataplus._M_p[0xd0] = '\0';
  local_560._M_dataplus._M_p[0xd1] = '\0';
  local_560._M_dataplus._M_p[0xd2] = '\0';
  local_560._M_dataplus._M_p[0xd3] = '\0';
  local_560._M_dataplus._M_p[0xd4] = '\0';
  local_560._M_dataplus._M_p[0xd5] = '\0';
  local_560._M_dataplus._M_p[0xd6] = '\0';
  local_560._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar4._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  FVar5 = tf2.super_FlowBuilder;
  pNVar1 = ((FVar4._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_560._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_560._M_dataplus._M_p[0] = '\0';
  local_560._M_dataplus._M_p[1] = '\0';
  local_560._M_dataplus._M_p[2] = '\0';
  local_560._M_dataplus._M_p[3] = '\0';
  local_560._M_dataplus._M_p[4] = '\0';
  local_560._M_dataplus._M_p[5] = '\0';
  local_560._M_dataplus._M_p[6] = '\0';
  local_560._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 8) = local_560._M_dataplus._M_p + 0x18;
  local_560._M_dataplus._M_p[0x10] = '\0';
  local_560._M_dataplus._M_p[0x11] = '\0';
  local_560._M_dataplus._M_p[0x12] = '\0';
  local_560._M_dataplus._M_p[0x13] = '\0';
  local_560._M_dataplus._M_p[0x14] = '\0';
  local_560._M_dataplus._M_p[0x15] = '\0';
  local_560._M_dataplus._M_p[0x16] = '\0';
  local_560._M_dataplus._M_p[0x17] = '\0';
  local_560._M_dataplus._M_p[0x18] = '\0';
  local_560._M_dataplus._M_p[0x28] = '\0';
  local_560._M_dataplus._M_p[0x29] = '\0';
  local_560._M_dataplus._M_p[0x2a] = '\0';
  local_560._M_dataplus._M_p[0x2b] = '\0';
  local_560._M_dataplus._M_p[0x2c] = '\0';
  local_560._M_dataplus._M_p[0x2d] = '\0';
  local_560._M_dataplus._M_p[0x2e] = '\0';
  local_560._M_dataplus._M_p[0x2f] = '\0';
  local_560._M_dataplus._M_p[0x30] = '\0';
  local_560._M_dataplus._M_p[0x31] = '\0';
  local_560._M_dataplus._M_p[0x32] = '\0';
  local_560._M_dataplus._M_p[0x33] = '\0';
  local_560._M_dataplus._M_p[0x34] = '\0';
  local_560._M_dataplus._M_p[0x35] = '\0';
  local_560._M_dataplus._M_p[0x36] = '\0';
  local_560._M_dataplus._M_p[0x37] = '\0';
  local_560._M_dataplus._M_p[0x38] = '\0';
  local_560._M_dataplus._M_p[0x39] = '\0';
  local_560._M_dataplus._M_p[0x3a] = '\0';
  local_560._M_dataplus._M_p[0x3b] = '\0';
  local_560._M_dataplus._M_p[0x3c] = '\0';
  local_560._M_dataplus._M_p[0x3d] = '\0';
  local_560._M_dataplus._M_p[0x3e] = '\0';
  local_560._M_dataplus._M_p[0x3f] = '\0';
  local_560._M_dataplus._M_p[0x40] = '\0';
  local_560._M_dataplus._M_p[0x41] = '\0';
  local_560._M_dataplus._M_p[0x42] = '\0';
  local_560._M_dataplus._M_p[0x43] = '\0';
  local_560._M_dataplus._M_p[0x44] = '\0';
  local_560._M_dataplus._M_p[0x45] = '\0';
  local_560._M_dataplus._M_p[0x46] = '\0';
  local_560._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 0x48) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x50) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x58) = local_560._M_dataplus._M_p + 0x80;
  local_560._M_dataplus._M_p[0x80] = '\0';
  local_560._M_dataplus._M_p[0x81] = '\0';
  local_560._M_dataplus._M_p[0x82] = '\0';
  local_560._M_dataplus._M_p[0x83] = '\0';
  local_560._M_dataplus._M_p[0x84] = '\0';
  local_560._M_dataplus._M_p[0x85] = '\0';
  local_560._M_dataplus._M_p[0x86] = '\0';
  local_560._M_dataplus._M_p[0x87] = '\0';
  local_560._M_dataplus._M_p[0x88] = '\0';
  local_560._M_dataplus._M_p[0x89] = '\0';
  local_560._M_dataplus._M_p[0x8a] = '\0';
  local_560._M_dataplus._M_p[0x8b] = '\0';
  *(int **)(local_560._M_dataplus._M_p + 0x90) = &c2;
  *(code **)(local_560._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:552:27)>
       ::_M_invoke;
  *(code **)(local_560._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:552:27)>
       ::_M_manager;
  local_560._M_dataplus._M_p[0xc0] = '\x01';
  local_560._M_dataplus._M_p[200] = '\0';
  local_560._M_dataplus._M_p[0xc9] = '\0';
  local_560._M_dataplus._M_p[0xca] = '\0';
  local_560._M_dataplus._M_p[0xcb] = '\0';
  local_560._M_dataplus._M_p[0xcc] = '\0';
  local_560._M_dataplus._M_p[0xcd] = '\0';
  local_560._M_dataplus._M_p[0xce] = '\0';
  local_560._M_dataplus._M_p[0xcf] = '\0';
  local_560._M_dataplus._M_p[0xd0] = '\0';
  local_560._M_dataplus._M_p[0xd1] = '\0';
  local_560._M_dataplus._M_p[0xd2] = '\0';
  local_560._M_dataplus._M_p[0xd3] = '\0';
  local_560._M_dataplus._M_p[0xd4] = '\0';
  local_560._M_dataplus._M_p[0xd5] = '\0';
  local_560._M_dataplus._M_p[0xd6] = '\0';
  local_560._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar5._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  pNVar2 = ((FVar5._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  local_560._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_560._M_dataplus._M_p[0] = '\0';
  local_560._M_dataplus._M_p[1] = '\0';
  local_560._M_dataplus._M_p[2] = '\0';
  local_560._M_dataplus._M_p[3] = '\0';
  local_560._M_dataplus._M_p[4] = '\0';
  local_560._M_dataplus._M_p[5] = '\0';
  local_560._M_dataplus._M_p[6] = '\0';
  local_560._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 8) = local_560._M_dataplus._M_p + 0x18;
  local_560._M_dataplus._M_p[0x10] = '\0';
  local_560._M_dataplus._M_p[0x11] = '\0';
  local_560._M_dataplus._M_p[0x12] = '\0';
  local_560._M_dataplus._M_p[0x13] = '\0';
  local_560._M_dataplus._M_p[0x14] = '\0';
  local_560._M_dataplus._M_p[0x15] = '\0';
  local_560._M_dataplus._M_p[0x16] = '\0';
  local_560._M_dataplus._M_p[0x17] = '\0';
  local_560._M_dataplus._M_p[0x18] = '\0';
  local_560._M_dataplus._M_p[0x28] = '\0';
  local_560._M_dataplus._M_p[0x29] = '\0';
  local_560._M_dataplus._M_p[0x2a] = '\0';
  local_560._M_dataplus._M_p[0x2b] = '\0';
  local_560._M_dataplus._M_p[0x2c] = '\0';
  local_560._M_dataplus._M_p[0x2d] = '\0';
  local_560._M_dataplus._M_p[0x2e] = '\0';
  local_560._M_dataplus._M_p[0x2f] = '\0';
  local_560._M_dataplus._M_p[0x30] = '\0';
  local_560._M_dataplus._M_p[0x31] = '\0';
  local_560._M_dataplus._M_p[0x32] = '\0';
  local_560._M_dataplus._M_p[0x33] = '\0';
  local_560._M_dataplus._M_p[0x34] = '\0';
  local_560._M_dataplus._M_p[0x35] = '\0';
  local_560._M_dataplus._M_p[0x36] = '\0';
  local_560._M_dataplus._M_p[0x37] = '\0';
  local_560._M_dataplus._M_p[0x38] = '\0';
  local_560._M_dataplus._M_p[0x39] = '\0';
  local_560._M_dataplus._M_p[0x3a] = '\0';
  local_560._M_dataplus._M_p[0x3b] = '\0';
  local_560._M_dataplus._M_p[0x3c] = '\0';
  local_560._M_dataplus._M_p[0x3d] = '\0';
  local_560._M_dataplus._M_p[0x3e] = '\0';
  local_560._M_dataplus._M_p[0x3f] = '\0';
  local_560._M_dataplus._M_p[0x40] = '\0';
  local_560._M_dataplus._M_p[0x41] = '\0';
  local_560._M_dataplus._M_p[0x42] = '\0';
  local_560._M_dataplus._M_p[0x43] = '\0';
  local_560._M_dataplus._M_p[0x44] = '\0';
  local_560._M_dataplus._M_p[0x45] = '\0';
  local_560._M_dataplus._M_p[0x46] = '\0';
  local_560._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 0x48) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x50) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x58) = local_560._M_dataplus._M_p + 0x80;
  local_560._M_dataplus._M_p[0x80] = '\0';
  local_560._M_dataplus._M_p[0x81] = '\0';
  local_560._M_dataplus._M_p[0x82] = '\0';
  local_560._M_dataplus._M_p[0x83] = '\0';
  local_560._M_dataplus._M_p[0x84] = '\0';
  local_560._M_dataplus._M_p[0x85] = '\0';
  local_560._M_dataplus._M_p[0x86] = '\0';
  local_560._M_dataplus._M_p[0x87] = '\0';
  local_560._M_dataplus._M_p[0x90] = '\0';
  local_560._M_dataplus._M_p[0x91] = '\0';
  local_560._M_dataplus._M_p[0x92] = '\0';
  local_560._M_dataplus._M_p[0x93] = '\0';
  local_560._M_dataplus._M_p[0x94] = '\0';
  local_560._M_dataplus._M_p[0x95] = '\0';
  local_560._M_dataplus._M_p[0x96] = '\0';
  local_560._M_dataplus._M_p[0x97] = '\0';
  *(int **)(local_560._M_dataplus._M_p + 0x88) = &c2;
  *(code **)(local_560._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:555:27)>
       ::_M_invoke;
  *(code **)(local_560._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:555:27)>
       ::_M_manager;
  local_560._M_dataplus._M_p[0xc0] = '\x04';
  local_560._M_dataplus._M_p[200] = '\0';
  local_560._M_dataplus._M_p[0xc9] = '\0';
  local_560._M_dataplus._M_p[0xca] = '\0';
  local_560._M_dataplus._M_p[0xcb] = '\0';
  local_560._M_dataplus._M_p[0xcc] = '\0';
  local_560._M_dataplus._M_p[0xcd] = '\0';
  local_560._M_dataplus._M_p[0xce] = '\0';
  local_560._M_dataplus._M_p[0xcf] = '\0';
  local_560._M_dataplus._M_p[0xd0] = '\0';
  local_560._M_dataplus._M_p[0xd1] = '\0';
  local_560._M_dataplus._M_p[0xd2] = '\0';
  local_560._M_dataplus._M_p[0xd3] = '\0';
  local_560._M_dataplus._M_p[0xd4] = '\0';
  local_560._M_dataplus._M_p[0xd5] = '\0';
  local_560._M_dataplus._M_p[0xd6] = '\0';
  local_560._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)tf2.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  pNVar3 = ((tf2.super_FlowBuilder._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  tf::Node::_precede(pNVar1,pNVar2);
  tf::Node::_precede(pNVar2,pNVar3);
  tf::Node::_precede(pNVar3,pNVar2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"c2A",(allocator<char> *)&init);
  std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"c2B",(allocator<char> *)&init);
  std::__cxx11::string::_M_assign((string *)&pNVar2->_name);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"c2C",(allocator<char> *)&init);
  std::__cxx11::string::_M_assign((string *)&pNVar3->_name);
  std::__cxx11::string::~string((string *)&local_560);
  FVar4 = tf3.super_FlowBuilder;
  pcVar6 = (pointer)operator_new(0xd8);
  pcVar6[0] = '\0';
  pcVar6[1] = '\0';
  pcVar6[2] = '\0';
  pcVar6[3] = '\0';
  pcVar6[4] = '\0';
  pcVar6[5] = '\0';
  pcVar6[6] = '\0';
  pcVar6[7] = '\0';
  *(pointer *)(pcVar6 + 8) = pcVar6 + 0x18;
  pcVar6[0x10] = '\0';
  pcVar6[0x11] = '\0';
  pcVar6[0x12] = '\0';
  pcVar6[0x13] = '\0';
  pcVar6[0x14] = '\0';
  pcVar6[0x15] = '\0';
  pcVar6[0x16] = '\0';
  pcVar6[0x17] = '\0';
  pcVar6[0x18] = '\0';
  pcVar6[0x28] = '\0';
  pcVar6[0x29] = '\0';
  pcVar6[0x2a] = '\0';
  pcVar6[0x2b] = '\0';
  pcVar6[0x2c] = '\0';
  pcVar6[0x2d] = '\0';
  pcVar6[0x2e] = '\0';
  pcVar6[0x2f] = '\0';
  pcVar6[0x30] = '\0';
  pcVar6[0x31] = '\0';
  pcVar6[0x32] = '\0';
  pcVar6[0x33] = '\0';
  pcVar6[0x34] = '\0';
  pcVar6[0x35] = '\0';
  pcVar6[0x36] = '\0';
  pcVar6[0x37] = '\0';
  pcVar6[0x38] = '\0';
  pcVar6[0x39] = '\0';
  pcVar6[0x3a] = '\0';
  pcVar6[0x3b] = '\0';
  pcVar6[0x3c] = '\0';
  pcVar6[0x3d] = '\0';
  pcVar6[0x3e] = '\0';
  pcVar6[0x3f] = '\0';
  pcVar6[0x40] = '\0';
  pcVar6[0x41] = '\0';
  pcVar6[0x42] = '\0';
  pcVar6[0x43] = '\0';
  pcVar6[0x44] = '\0';
  pcVar6[0x45] = '\0';
  pcVar6[0x46] = '\0';
  pcVar6[0x47] = '\0';
  *(pointer *)(pcVar6 + 0x48) = pcVar6 + 0x60;
  *(pointer *)(pcVar6 + 0x50) = pcVar6 + 0x60;
  *(pointer *)(pcVar6 + 0x58) = pcVar6 + 0x80;
  pcVar6[0x80] = '\0';
  pcVar6[0x81] = '\0';
  pcVar6[0x82] = '\0';
  pcVar6[0x83] = '\0';
  pcVar6[0x84] = '\0';
  pcVar6[0x85] = '\0';
  pcVar6[0x86] = '\0';
  pcVar6[0x87] = '\0';
  pcVar6[0x88] = '\0';
  pcVar6[0x89] = '\0';
  pcVar6[0x8a] = '\0';
  pcVar6[0x8b] = '\0';
  pcVar6[0x8c] = '\0';
  pcVar6[0x8d] = '\0';
  pcVar6[0x8e] = '\0';
  pcVar6[0x8f] = '\0';
  pcVar6[0x90] = '\0';
  pcVar6[0x91] = '\0';
  pcVar6[0x92] = '\0';
  pcVar6[0x93] = '\0';
  pcVar6[0x94] = '\0';
  pcVar6[0x95] = '\0';
  pcVar6[0x96] = '\0';
  pcVar6[0x97] = '\0';
  pcVar6[0x98] = '\0';
  pcVar6[0x99] = '\0';
  pcVar6[0x9a] = '\0';
  pcVar6[0x9b] = '\0';
  pcVar6[0x9c] = '\0';
  pcVar6[0x9d] = '\0';
  pcVar6[0x9e] = '\0';
  pcVar6[0x9f] = '\0';
  pcVar6[0xa0] = '\0';
  pcVar6[0xa1] = '\0';
  pcVar6[0xa2] = '\0';
  pcVar6[0xa3] = '\0';
  pcVar6[0xa4] = '\0';
  pcVar6[0xa5] = '\0';
  pcVar6[0xa6] = '\0';
  pcVar6[0xa7] = '\0';
  plVar7 = (long *)operator_new(0x18);
  *plVar7 = (long)&c1;
  plVar7[1] = (long)&c2;
  plVar7[2] = (long)&c2_repeat;
  *(long **)(pcVar6 + 0x88) = plVar7;
  *(code **)(pcVar6 + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:564:27)>
       ::_M_invoke;
  *(code **)(pcVar6 + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:564:27)>
       ::_M_manager;
  pcVar6[0xc0] = '\x01';
  pcVar6[200] = '\0';
  pcVar6[0xc9] = '\0';
  pcVar6[0xca] = '\0';
  pcVar6[0xcb] = '\0';
  pcVar6[0xcc] = '\0';
  pcVar6[0xcd] = '\0';
  pcVar6[0xce] = '\0';
  pcVar6[0xcf] = '\0';
  pcVar6[0xd0] = '\0';
  pcVar6[0xd1] = '\0';
  pcVar6[0xd2] = '\0';
  pcVar6[0xd3] = '\0';
  pcVar6[0xd4] = '\0';
  pcVar6[0xd5] = '\0';
  pcVar6[0xd6] = '\0';
  pcVar6[0xd7] = '\0';
  local_560._M_dataplus._M_p = pcVar6;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar4._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  pNVar1 = ((FVar4._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"init",(allocator<char> *)&loop1);
  std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
  init._node = pNVar1;
  std::__cxx11::string::~string((string *)&local_560);
  FVar4 = tf3.super_FlowBuilder;
  local_560._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_560._M_dataplus._M_p[0] = '\0';
  local_560._M_dataplus._M_p[1] = '\0';
  local_560._M_dataplus._M_p[2] = '\0';
  local_560._M_dataplus._M_p[3] = '\0';
  local_560._M_dataplus._M_p[4] = '\0';
  local_560._M_dataplus._M_p[5] = '\0';
  local_560._M_dataplus._M_p[6] = '\0';
  local_560._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 8) = local_560._M_dataplus._M_p + 0x18;
  local_560._M_dataplus._M_p[0x10] = '\0';
  local_560._M_dataplus._M_p[0x11] = '\0';
  local_560._M_dataplus._M_p[0x12] = '\0';
  local_560._M_dataplus._M_p[0x13] = '\0';
  local_560._M_dataplus._M_p[0x14] = '\0';
  local_560._M_dataplus._M_p[0x15] = '\0';
  local_560._M_dataplus._M_p[0x16] = '\0';
  local_560._M_dataplus._M_p[0x17] = '\0';
  local_560._M_dataplus._M_p[0x18] = '\0';
  local_560._M_dataplus._M_p[0x28] = '\0';
  local_560._M_dataplus._M_p[0x29] = '\0';
  local_560._M_dataplus._M_p[0x2a] = '\0';
  local_560._M_dataplus._M_p[0x2b] = '\0';
  local_560._M_dataplus._M_p[0x2c] = '\0';
  local_560._M_dataplus._M_p[0x2d] = '\0';
  local_560._M_dataplus._M_p[0x2e] = '\0';
  local_560._M_dataplus._M_p[0x2f] = '\0';
  local_560._M_dataplus._M_p[0x30] = '\0';
  local_560._M_dataplus._M_p[0x31] = '\0';
  local_560._M_dataplus._M_p[0x32] = '\0';
  local_560._M_dataplus._M_p[0x33] = '\0';
  local_560._M_dataplus._M_p[0x34] = '\0';
  local_560._M_dataplus._M_p[0x35] = '\0';
  local_560._M_dataplus._M_p[0x36] = '\0';
  local_560._M_dataplus._M_p[0x37] = '\0';
  local_560._M_dataplus._M_p[0x38] = '\0';
  local_560._M_dataplus._M_p[0x39] = '\0';
  local_560._M_dataplus._M_p[0x3a] = '\0';
  local_560._M_dataplus._M_p[0x3b] = '\0';
  local_560._M_dataplus._M_p[0x3c] = '\0';
  local_560._M_dataplus._M_p[0x3d] = '\0';
  local_560._M_dataplus._M_p[0x3e] = '\0';
  local_560._M_dataplus._M_p[0x3f] = '\0';
  local_560._M_dataplus._M_p[0x40] = '\0';
  local_560._M_dataplus._M_p[0x41] = '\0';
  local_560._M_dataplus._M_p[0x42] = '\0';
  local_560._M_dataplus._M_p[0x43] = '\0';
  local_560._M_dataplus._M_p[0x44] = '\0';
  local_560._M_dataplus._M_p[0x45] = '\0';
  local_560._M_dataplus._M_p[0x46] = '\0';
  local_560._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 0x48) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x50) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x58) = local_560._M_dataplus._M_p + 0x80;
  local_560._M_dataplus._M_p[0x80] = '\0';
  local_560._M_dataplus._M_p[0x81] = '\0';
  local_560._M_dataplus._M_p[0x82] = '\0';
  local_560._M_dataplus._M_p[0x83] = '\0';
  local_560._M_dataplus._M_p[0x84] = '\0';
  local_560._M_dataplus._M_p[0x85] = '\0';
  local_560._M_dataplus._M_p[0x86] = '\0';
  local_560._M_dataplus._M_p[0x87] = '\0';
  local_560._M_dataplus._M_p[0x90] = '\0';
  local_560._M_dataplus._M_p[0x91] = '\0';
  local_560._M_dataplus._M_p[0x92] = '\0';
  local_560._M_dataplus._M_p[0x93] = '\0';
  local_560._M_dataplus._M_p[0x94] = '\0';
  local_560._M_dataplus._M_p[0x95] = '\0';
  local_560._M_dataplus._M_p[0x96] = '\0';
  local_560._M_dataplus._M_p[0x97] = '\0';
  *(int **)(local_560._M_dataplus._M_p + 0x88) = &c2;
  *(code **)(local_560._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:568:28)>
       ::_M_invoke;
  *(code **)(local_560._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:568:28)>
       ::_M_manager;
  local_560._M_dataplus._M_p[0xc0] = '\x04';
  local_560._M_dataplus._M_p[200] = '\0';
  local_560._M_dataplus._M_p[0xc9] = '\0';
  local_560._M_dataplus._M_p[0xca] = '\0';
  local_560._M_dataplus._M_p[0xcb] = '\0';
  local_560._M_dataplus._M_p[0xcc] = '\0';
  local_560._M_dataplus._M_p[0xcd] = '\0';
  local_560._M_dataplus._M_p[0xce] = '\0';
  local_560._M_dataplus._M_p[0xcf] = '\0';
  local_560._M_dataplus._M_p[0xd0] = '\0';
  local_560._M_dataplus._M_p[0xd1] = '\0';
  local_560._M_dataplus._M_p[0xd2] = '\0';
  local_560._M_dataplus._M_p[0xd3] = '\0';
  local_560._M_dataplus._M_p[0xd4] = '\0';
  local_560._M_dataplus._M_p[0xd5] = '\0';
  local_560._M_dataplus._M_p[0xd6] = '\0';
  local_560._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar4._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  pNVar1 = ((FVar4._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"loop1",(allocator<char> *)&loop2);
  std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
  loop1._node = pNVar1;
  std::__cxx11::string::~string((string *)&local_560);
  FVar4 = tf3.super_FlowBuilder;
  local_560._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_560._M_dataplus._M_p[0] = '\0';
  local_560._M_dataplus._M_p[1] = '\0';
  local_560._M_dataplus._M_p[2] = '\0';
  local_560._M_dataplus._M_p[3] = '\0';
  local_560._M_dataplus._M_p[4] = '\0';
  local_560._M_dataplus._M_p[5] = '\0';
  local_560._M_dataplus._M_p[6] = '\0';
  local_560._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 8) = local_560._M_dataplus._M_p + 0x18;
  local_560._M_dataplus._M_p[0x10] = '\0';
  local_560._M_dataplus._M_p[0x11] = '\0';
  local_560._M_dataplus._M_p[0x12] = '\0';
  local_560._M_dataplus._M_p[0x13] = '\0';
  local_560._M_dataplus._M_p[0x14] = '\0';
  local_560._M_dataplus._M_p[0x15] = '\0';
  local_560._M_dataplus._M_p[0x16] = '\0';
  local_560._M_dataplus._M_p[0x17] = '\0';
  local_560._M_dataplus._M_p[0x18] = '\0';
  local_560._M_dataplus._M_p[0x28] = '\0';
  local_560._M_dataplus._M_p[0x29] = '\0';
  local_560._M_dataplus._M_p[0x2a] = '\0';
  local_560._M_dataplus._M_p[0x2b] = '\0';
  local_560._M_dataplus._M_p[0x2c] = '\0';
  local_560._M_dataplus._M_p[0x2d] = '\0';
  local_560._M_dataplus._M_p[0x2e] = '\0';
  local_560._M_dataplus._M_p[0x2f] = '\0';
  local_560._M_dataplus._M_p[0x30] = '\0';
  local_560._M_dataplus._M_p[0x31] = '\0';
  local_560._M_dataplus._M_p[0x32] = '\0';
  local_560._M_dataplus._M_p[0x33] = '\0';
  local_560._M_dataplus._M_p[0x34] = '\0';
  local_560._M_dataplus._M_p[0x35] = '\0';
  local_560._M_dataplus._M_p[0x36] = '\0';
  local_560._M_dataplus._M_p[0x37] = '\0';
  local_560._M_dataplus._M_p[0x38] = '\0';
  local_560._M_dataplus._M_p[0x39] = '\0';
  local_560._M_dataplus._M_p[0x3a] = '\0';
  local_560._M_dataplus._M_p[0x3b] = '\0';
  local_560._M_dataplus._M_p[0x3c] = '\0';
  local_560._M_dataplus._M_p[0x3d] = '\0';
  local_560._M_dataplus._M_p[0x3e] = '\0';
  local_560._M_dataplus._M_p[0x3f] = '\0';
  local_560._M_dataplus._M_p[0x40] = '\0';
  local_560._M_dataplus._M_p[0x41] = '\0';
  local_560._M_dataplus._M_p[0x42] = '\0';
  local_560._M_dataplus._M_p[0x43] = '\0';
  local_560._M_dataplus._M_p[0x44] = '\0';
  local_560._M_dataplus._M_p[0x45] = '\0';
  local_560._M_dataplus._M_p[0x46] = '\0';
  local_560._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 0x48) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x50) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x58) = local_560._M_dataplus._M_p + 0x80;
  local_560._M_dataplus._M_p[0x80] = '\0';
  local_560._M_dataplus._M_p[0x81] = '\0';
  local_560._M_dataplus._M_p[0x82] = '\0';
  local_560._M_dataplus._M_p[0x83] = '\0';
  local_560._M_dataplus._M_p[0x84] = '\0';
  local_560._M_dataplus._M_p[0x85] = '\0';
  local_560._M_dataplus._M_p[0x86] = '\0';
  local_560._M_dataplus._M_p[0x87] = '\0';
  *(int **)(local_560._M_dataplus._M_p + 0x88) = &c2;
  *(int **)(local_560._M_dataplus._M_p + 0x90) = &c2_repeat;
  *(code **)(local_560._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:572:28)>
       ::_M_invoke;
  *(code **)(local_560._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:572:28)>
       ::_M_manager;
  local_560._M_dataplus._M_p[0xc0] = '\x04';
  local_560._M_dataplus._M_p[200] = '\0';
  local_560._M_dataplus._M_p[0xc9] = '\0';
  local_560._M_dataplus._M_p[0xca] = '\0';
  local_560._M_dataplus._M_p[0xcb] = '\0';
  local_560._M_dataplus._M_p[0xcc] = '\0';
  local_560._M_dataplus._M_p[0xcd] = '\0';
  local_560._M_dataplus._M_p[0xce] = '\0';
  local_560._M_dataplus._M_p[0xcf] = '\0';
  local_560._M_dataplus._M_p[0xd0] = '\0';
  local_560._M_dataplus._M_p[0xd1] = '\0';
  local_560._M_dataplus._M_p[0xd2] = '\0';
  local_560._M_dataplus._M_p[0xd3] = '\0';
  local_560._M_dataplus._M_p[0xd4] = '\0';
  local_560._M_dataplus._M_p[0xd5] = '\0';
  local_560._M_dataplus._M_p[0xd6] = '\0';
  local_560._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar4._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  pNVar1 = ((FVar4._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"loop2",(allocator<char> *)&sync);
  std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
  loop2._node = pNVar1;
  std::__cxx11::string::~string((string *)&local_560);
  FVar4 = tf3.super_FlowBuilder;
  local_560._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_560._M_dataplus._M_p[0] = '\0';
  local_560._M_dataplus._M_p[1] = '\0';
  local_560._M_dataplus._M_p[2] = '\0';
  local_560._M_dataplus._M_p[3] = '\0';
  local_560._M_dataplus._M_p[4] = '\0';
  local_560._M_dataplus._M_p[5] = '\0';
  local_560._M_dataplus._M_p[6] = '\0';
  local_560._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 8) = local_560._M_dataplus._M_p + 0x18;
  local_560._M_dataplus._M_p[0x10] = '\0';
  local_560._M_dataplus._M_p[0x11] = '\0';
  local_560._M_dataplus._M_p[0x12] = '\0';
  local_560._M_dataplus._M_p[0x13] = '\0';
  local_560._M_dataplus._M_p[0x14] = '\0';
  local_560._M_dataplus._M_p[0x15] = '\0';
  local_560._M_dataplus._M_p[0x16] = '\0';
  local_560._M_dataplus._M_p[0x17] = '\0';
  local_560._M_dataplus._M_p[0x18] = '\0';
  local_560._M_dataplus._M_p[0x28] = '\0';
  local_560._M_dataplus._M_p[0x29] = '\0';
  local_560._M_dataplus._M_p[0x2a] = '\0';
  local_560._M_dataplus._M_p[0x2b] = '\0';
  local_560._M_dataplus._M_p[0x2c] = '\0';
  local_560._M_dataplus._M_p[0x2d] = '\0';
  local_560._M_dataplus._M_p[0x2e] = '\0';
  local_560._M_dataplus._M_p[0x2f] = '\0';
  local_560._M_dataplus._M_p[0x30] = '\0';
  local_560._M_dataplus._M_p[0x31] = '\0';
  local_560._M_dataplus._M_p[0x32] = '\0';
  local_560._M_dataplus._M_p[0x33] = '\0';
  local_560._M_dataplus._M_p[0x34] = '\0';
  local_560._M_dataplus._M_p[0x35] = '\0';
  local_560._M_dataplus._M_p[0x36] = '\0';
  local_560._M_dataplus._M_p[0x37] = '\0';
  local_560._M_dataplus._M_p[0x38] = '\0';
  local_560._M_dataplus._M_p[0x39] = '\0';
  local_560._M_dataplus._M_p[0x3a] = '\0';
  local_560._M_dataplus._M_p[0x3b] = '\0';
  local_560._M_dataplus._M_p[0x3c] = '\0';
  local_560._M_dataplus._M_p[0x3d] = '\0';
  local_560._M_dataplus._M_p[0x3e] = '\0';
  local_560._M_dataplus._M_p[0x3f] = '\0';
  local_560._M_dataplus._M_p[0x40] = '\0';
  local_560._M_dataplus._M_p[0x41] = '\0';
  local_560._M_dataplus._M_p[0x42] = '\0';
  local_560._M_dataplus._M_p[0x43] = '\0';
  local_560._M_dataplus._M_p[0x44] = '\0';
  local_560._M_dataplus._M_p[0x45] = '\0';
  local_560._M_dataplus._M_p[0x46] = '\0';
  local_560._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 0x48) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x50) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x58) = local_560._M_dataplus._M_p + 0x80;
  local_560._M_dataplus._M_p[0x80] = '\0';
  local_560._M_dataplus._M_p[0x81] = '\0';
  local_560._M_dataplus._M_p[0x82] = '\0';
  local_560._M_dataplus._M_p[0x83] = '\0';
  local_560._M_dataplus._M_p[0x84] = '\0';
  local_560._M_dataplus._M_p[0x85] = '\0';
  local_560._M_dataplus._M_p[0x86] = '\0';
  local_560._M_dataplus._M_p[0x87] = '\0';
  *(int **)(local_560._M_dataplus._M_p + 0x88) = &c2;
  *(int **)(local_560._M_dataplus._M_p + 0x90) = &c2_repeat;
  *(code **)(local_560._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:577:27)>
       ::_M_invoke;
  *(code **)(local_560._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:577:27)>
       ::_M_manager;
  local_560._M_dataplus._M_p[0xc0] = '\x01';
  local_560._M_dataplus._M_p[200] = '\0';
  local_560._M_dataplus._M_p[0xc9] = '\0';
  local_560._M_dataplus._M_p[0xca] = '\0';
  local_560._M_dataplus._M_p[0xcb] = '\0';
  local_560._M_dataplus._M_p[0xcc] = '\0';
  local_560._M_dataplus._M_p[0xcd] = '\0';
  local_560._M_dataplus._M_p[0xce] = '\0';
  local_560._M_dataplus._M_p[0xcf] = '\0';
  local_560._M_dataplus._M_p[0xd0] = '\0';
  local_560._M_dataplus._M_p[0xd1] = '\0';
  local_560._M_dataplus._M_p[0xd2] = '\0';
  local_560._M_dataplus._M_p[0xd3] = '\0';
  local_560._M_dataplus._M_p[0xd4] = '\0';
  local_560._M_dataplus._M_p[0xd5] = '\0';
  local_560._M_dataplus._M_p[0xd6] = '\0';
  local_560._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar4._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  pNVar2 = ((FVar4._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"sync",(allocator<char> *)&mod0);
  std::__cxx11::string::_M_assign((string *)&pNVar2->_name);
  sync._node = pNVar2;
  std::__cxx11::string::~string((string *)&local_560);
  FVar4 = tf3.super_FlowBuilder;
  pcVar6 = (pointer)operator_new(0xd8);
  pcVar6[0] = '\0';
  pcVar6[1] = '\0';
  pcVar6[2] = '\0';
  pcVar6[3] = '\0';
  pcVar6[4] = '\0';
  pcVar6[5] = '\0';
  pcVar6[6] = '\0';
  pcVar6[7] = '\0';
  *(pointer *)(pcVar6 + 8) = pcVar6 + 0x18;
  pcVar6[0x10] = '\0';
  pcVar6[0x11] = '\0';
  pcVar6[0x12] = '\0';
  pcVar6[0x13] = '\0';
  pcVar6[0x14] = '\0';
  pcVar6[0x15] = '\0';
  pcVar6[0x16] = '\0';
  pcVar6[0x17] = '\0';
  pcVar6[0x18] = '\0';
  pcVar6[0x28] = '\0';
  pcVar6[0x29] = '\0';
  pcVar6[0x2a] = '\0';
  pcVar6[0x2b] = '\0';
  pcVar6[0x2c] = '\0';
  pcVar6[0x2d] = '\0';
  pcVar6[0x2e] = '\0';
  pcVar6[0x2f] = '\0';
  pcVar6[0x30] = '\0';
  pcVar6[0x31] = '\0';
  pcVar6[0x32] = '\0';
  pcVar6[0x33] = '\0';
  pcVar6[0x34] = '\0';
  pcVar6[0x35] = '\0';
  pcVar6[0x36] = '\0';
  pcVar6[0x37] = '\0';
  pcVar6[0x38] = '\0';
  pcVar6[0x39] = '\0';
  pcVar6[0x3a] = '\0';
  pcVar6[0x3b] = '\0';
  pcVar6[0x3c] = '\0';
  pcVar6[0x3d] = '\0';
  pcVar6[0x3e] = '\0';
  pcVar6[0x3f] = '\0';
  pcVar6[0x40] = '\0';
  pcVar6[0x41] = '\0';
  pcVar6[0x42] = '\0';
  pcVar6[0x43] = '\0';
  pcVar6[0x44] = '\0';
  pcVar6[0x45] = '\0';
  pcVar6[0x46] = '\0';
  pcVar6[0x47] = '\0';
  *(pointer *)(pcVar6 + 0x48) = pcVar6 + 0x60;
  *(pointer *)(pcVar6 + 0x50) = pcVar6 + 0x60;
  *(pointer *)(pcVar6 + 0x58) = pcVar6 + 0x80;
  pcVar6[0x80] = '\0';
  pcVar6[0x81] = '\0';
  pcVar6[0x82] = '\0';
  pcVar6[0x83] = '\0';
  pcVar6[0x84] = '\0';
  pcVar6[0x85] = '\0';
  pcVar6[0x86] = '\0';
  pcVar6[0x87] = '\0';
  pcVar6[0x88] = '\0';
  pcVar6[0x89] = '\0';
  pcVar6[0x8a] = '\0';
  pcVar6[0x8b] = '\0';
  pcVar6[0x8c] = '\0';
  pcVar6[0x8d] = '\0';
  pcVar6[0x8e] = '\0';
  pcVar6[0x8f] = '\0';
  pcVar6[0x90] = '\0';
  pcVar6[0x91] = '\0';
  pcVar6[0x92] = '\0';
  pcVar6[0x93] = '\0';
  pcVar6[0x94] = '\0';
  pcVar6[0x95] = '\0';
  pcVar6[0x96] = '\0';
  pcVar6[0x97] = '\0';
  pcVar6[0x98] = '\0';
  pcVar6[0x99] = '\0';
  pcVar6[0x9a] = '\0';
  pcVar6[0x9b] = '\0';
  pcVar6[0x9c] = '\0';
  pcVar6[0x9d] = '\0';
  pcVar6[0x9e] = '\0';
  pcVar6[0x9f] = '\0';
  pcVar6[0xa0] = '\0';
  pcVar6[0xa1] = '\0';
  pcVar6[0xa2] = '\0';
  pcVar6[0xa3] = '\0';
  pcVar6[0xa4] = '\0';
  pcVar6[0xa5] = '\0';
  pcVar6[0xa6] = '\0';
  pcVar6[0xa7] = '\0';
  plVar7 = (long *)operator_new(0x18);
  *plVar7 = (long)&c1;
  plVar7[1] = (long)&c2;
  plVar7[2] = (long)&c2_repeat;
  *(long **)(pcVar6 + 0x88) = plVar7;
  *(code **)(pcVar6 + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:583:27)>
       ::_M_invoke;
  *(code **)(pcVar6 + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:583:27)>
       ::_M_manager;
  pcVar6[0xc0] = '\x01';
  pcVar6[200] = '\0';
  pcVar6[0xc9] = '\0';
  pcVar6[0xca] = '\0';
  pcVar6[0xcb] = '\0';
  pcVar6[0xcc] = '\0';
  pcVar6[0xcd] = '\0';
  pcVar6[0xce] = '\0';
  pcVar6[0xcf] = '\0';
  pcVar6[0xd0] = '\0';
  pcVar6[0xd1] = '\0';
  pcVar6[0xd2] = '\0';
  pcVar6[0xd3] = '\0';
  pcVar6[0xd4] = '\0';
  pcVar6[0xd5] = '\0';
  pcVar6[0xd6] = '\0';
  pcVar6[0xd7] = '\0';
  local_560._M_dataplus._M_p = pcVar6;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar4._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  pNVar2 = ((FVar4._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"grab",(allocator<char> *)&mod0);
  std::__cxx11::string::_M_assign((string *)&pNVar2->_name);
  std::__cxx11::string::~string((string *)&local_560);
  tf::FlowBuilder::composed_of<tf::Taskflow>((FlowBuilder *)&sbf1,&tf3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"module0",(allocator<char> *)&mod2);
  std::__cxx11::string::_M_assign((string *)&(sbf1._node)->_name);
  mod0 = sbf1;
  std::__cxx11::string::~string((string *)&local_560);
  tf::FlowBuilder::composed_of<tf::Taskflow>((FlowBuilder *)&sbf1,&tf3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"module1",(allocator<char> *)&mod2);
  std::__cxx11::string::_M_assign((string *)&(sbf1._node)->_name);
  this = sbf1;
  std::__cxx11::string::~string((string *)&local_560);
  local_560._M_dataplus._M_p = (pointer)operator_new(0xd8);
  local_560._M_dataplus._M_p[0] = '\0';
  local_560._M_dataplus._M_p[1] = '\0';
  local_560._M_dataplus._M_p[2] = '\0';
  local_560._M_dataplus._M_p[3] = '\0';
  local_560._M_dataplus._M_p[4] = '\0';
  local_560._M_dataplus._M_p[5] = '\0';
  local_560._M_dataplus._M_p[6] = '\0';
  local_560._M_dataplus._M_p[7] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 8) = local_560._M_dataplus._M_p + 0x18;
  local_560._M_dataplus._M_p[0x10] = '\0';
  local_560._M_dataplus._M_p[0x11] = '\0';
  local_560._M_dataplus._M_p[0x12] = '\0';
  local_560._M_dataplus._M_p[0x13] = '\0';
  local_560._M_dataplus._M_p[0x14] = '\0';
  local_560._M_dataplus._M_p[0x15] = '\0';
  local_560._M_dataplus._M_p[0x16] = '\0';
  local_560._M_dataplus._M_p[0x17] = '\0';
  local_560._M_dataplus._M_p[0x18] = '\0';
  local_560._M_dataplus._M_p[0x28] = '\0';
  local_560._M_dataplus._M_p[0x29] = '\0';
  local_560._M_dataplus._M_p[0x2a] = '\0';
  local_560._M_dataplus._M_p[0x2b] = '\0';
  local_560._M_dataplus._M_p[0x2c] = '\0';
  local_560._M_dataplus._M_p[0x2d] = '\0';
  local_560._M_dataplus._M_p[0x2e] = '\0';
  local_560._M_dataplus._M_p[0x2f] = '\0';
  local_560._M_dataplus._M_p[0x30] = '\0';
  local_560._M_dataplus._M_p[0x31] = '\0';
  local_560._M_dataplus._M_p[0x32] = '\0';
  local_560._M_dataplus._M_p[0x33] = '\0';
  local_560._M_dataplus._M_p[0x34] = '\0';
  local_560._M_dataplus._M_p[0x35] = '\0';
  local_560._M_dataplus._M_p[0x36] = '\0';
  local_560._M_dataplus._M_p[0x37] = '\0';
  local_560._M_dataplus._M_p[0x38] = '\0';
  local_560._M_dataplus._M_p[0x39] = '\0';
  local_560._M_dataplus._M_p[0x3a] = '\0';
  local_560._M_dataplus._M_p[0x3b] = '\0';
  local_560._M_dataplus._M_p[0x3c] = '\0';
  local_560._M_dataplus._M_p[0x3d] = '\0';
  local_560._M_dataplus._M_p[0x3e] = '\0';
  local_560._M_dataplus._M_p[0x3f] = '\0';
  local_560._M_dataplus._M_p[0x40] = '\0';
  local_560._M_dataplus._M_p[0x41] = '\0';
  local_560._M_dataplus._M_p[0x42] = '\0';
  local_560._M_dataplus._M_p[0x43] = '\0';
  local_560._M_dataplus._M_p[0x44] = '\0';
  local_560._M_dataplus._M_p[0x45] = '\0';
  local_560._M_dataplus._M_p[0x46] = '\0';
  local_560._M_dataplus._M_p[0x47] = '\0';
  *(pointer *)(local_560._M_dataplus._M_p + 0x48) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x50) = local_560._M_dataplus._M_p + 0x60;
  *(pointer *)(local_560._M_dataplus._M_p + 0x58) = local_560._M_dataplus._M_p + 0x80;
  local_560._M_dataplus._M_p[0x80] = '\0';
  local_560._M_dataplus._M_p[0x81] = '\0';
  local_560._M_dataplus._M_p[0x82] = '\0';
  local_560._M_dataplus._M_p[0x83] = '\0';
  local_560._M_dataplus._M_p[0x84] = '\0';
  local_560._M_dataplus._M_p[0x85] = '\0';
  local_560._M_dataplus._M_p[0x86] = '\0';
  local_560._M_dataplus._M_p[0x87] = '\0';
  local_560._M_dataplus._M_p[0x90] = '\0';
  local_560._M_dataplus._M_p[0x91] = '\0';
  local_560._M_dataplus._M_p[0x92] = '\0';
  local_560._M_dataplus._M_p[0x93] = '\0';
  local_560._M_dataplus._M_p[0x94] = '\0';
  local_560._M_dataplus._M_p[0x95] = '\0';
  local_560._M_dataplus._M_p[0x96] = '\0';
  local_560._M_dataplus._M_p[0x97] = '\0';
  *(Taskflow **)(local_560._M_dataplus._M_p + 0x88) = &tf1;
  *(code **)(local_560._M_dataplus._M_p + 0xa0) =
       std::
       _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:591:27)>
       ::_M_invoke;
  *(code **)(local_560._M_dataplus._M_p + 0x98) =
       std::
       _Function_handler<void_(tf::Subflow_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_control_flow.cpp:591:27)>
       ::_M_manager;
  local_560._M_dataplus._M_p[0xa8] = '\0';
  local_560._M_dataplus._M_p[0xa9] = '\0';
  local_560._M_dataplus._M_p[0xaa] = '\0';
  local_560._M_dataplus._M_p[0xab] = '\0';
  local_560._M_dataplus._M_p[0xac] = '\0';
  local_560._M_dataplus._M_p[0xad] = '\0';
  local_560._M_dataplus._M_p[0xae] = '\0';
  local_560._M_dataplus._M_p[0xaf] = '\0';
  local_560._M_dataplus._M_p[0xb0] = '\0';
  local_560._M_dataplus._M_p[0xb1] = '\0';
  local_560._M_dataplus._M_p[0xb2] = '\0';
  local_560._M_dataplus._M_p[0xb3] = '\0';
  local_560._M_dataplus._M_p[0xb4] = '\0';
  local_560._M_dataplus._M_p[0xb5] = '\0';
  local_560._M_dataplus._M_p[0xb6] = '\0';
  local_560._M_dataplus._M_p[0xb7] = '\0';
  local_560._M_dataplus._M_p[0xb8] = '\0';
  local_560._M_dataplus._M_p[0xb9] = '\0';
  local_560._M_dataplus._M_p[0xba] = '\0';
  local_560._M_dataplus._M_p[0xbb] = '\0';
  local_560._M_dataplus._M_p[0xbc] = '\0';
  local_560._M_dataplus._M_p[0xbd] = '\0';
  local_560._M_dataplus._M_p[0xbe] = '\0';
  local_560._M_dataplus._M_p[0xbf] = '\0';
  local_560._M_dataplus._M_p[0xc0] = '\x03';
  local_560._M_dataplus._M_p[200] = '\0';
  local_560._M_dataplus._M_p[0xc9] = '\0';
  local_560._M_dataplus._M_p[0xca] = '\0';
  local_560._M_dataplus._M_p[0xcb] = '\0';
  local_560._M_dataplus._M_p[0xcc] = '\0';
  local_560._M_dataplus._M_p[0xcd] = '\0';
  local_560._M_dataplus._M_p[0xce] = '\0';
  local_560._M_dataplus._M_p[0xcf] = '\0';
  local_560._M_dataplus._M_p[0xd0] = '\0';
  local_560._M_dataplus._M_p[0xd1] = '\0';
  local_560._M_dataplus._M_p[0xd2] = '\0';
  local_560._M_dataplus._M_p[0xd3] = '\0';
  local_560._M_dataplus._M_p[0xd4] = '\0';
  local_560._M_dataplus._M_p[0xd5] = '\0';
  local_560._M_dataplus._M_p[0xd6] = '\0';
  local_560._M_dataplus._M_p[0xd7] = '\0';
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)tf3.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_560);
  pNVar3 = ((tf3.super_FlowBuilder._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_560,"sbf1",(allocator<char> *)&mod2);
  std::__cxx11::string::_M_assign((string *)&pNVar3->_name);
  sbf1._node = pNVar3;
  std::__cxx11::string::~string((string *)&local_560);
  tf::FlowBuilder::composed_of<tf::Taskflow>(&local_4f8,&tf3);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,"module2",&local_529);
  std::__cxx11::string::_M_assign
            ((string *)
             &((local_4f8._graph)->
              super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ).
              super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  mod2._node = (Node *)local_4f8._graph;
  std::__cxx11::string::~string((string *)&local_560);
  tf::Task::precede<tf::Task&,tf::Task&,tf::Task&>(&init,&mod0,&sbf1,&loop1);
  tf::Task::precede<tf::Task&,tf::Task&>(&loop1,&loop1,&mod2);
  tf::Node::_precede(mod2._node,pNVar1);
  tf::Task::precede<tf::Task&,tf::Task&>(&loop2,&loop1,&sync);
  tf::Node::_precede(mod0._node,pNVar2);
  tf::Node::_precede(sbf1._node,this._node);
  tf::Node::_precede(this._node,pNVar2);
  tf::Node::_precede(sync._node,pNVar2);
  tf::Executor::run(&local_3e0,&executor,&tf3);
  tf::Future<void>::~Future(&local_3e0);
  tf::Executor::run_n(&local_400,&executor,&tf3,10);
  tf::Future<void>::~Future(&local_400);
  tf::Executor::wait_for_all(&executor);
  tf::Taskflow::~Taskflow(&tf3);
  tf::Taskflow::~Taskflow(&tf2);
  tf::Taskflow::~Taskflow(&tf1);
  tf::Taskflow::~Taskflow(&tf0);
  tf::Executor::~Executor(&executor);
  return;
}

Assistant:

void hierarchical_condition(unsigned w) {

  tf::Executor executor(w);
  tf::Taskflow tf0("c0");
  tf::Taskflow tf1("c1");
  tf::Taskflow tf2("c2");
  tf::Taskflow tf3("top");

  int c1, c2, c2_repeat;

  auto c1A = tf1.emplace( [&](){ c1=0; } );
  auto c1B = tf1.emplace( [&, state=0] () mutable {
    REQUIRE(state++ % 100 == c1 % 100);
  });
  auto c1C = tf1.emplace( [&](){ return (++c1 < 100) ? 0 : 1; });

  c1A.precede(c1B);
  c1B.precede(c1C);
  c1C.precede(c1B);
  c1A.name("c1A");
  c1B.name("c1B");
  c1C.name("c1C");

  auto c2A = tf2.emplace( [&](){ REQUIRE(c2 == 100); c2 = 0; } );
  auto c2B = tf2.emplace( [&, state=0] () mutable {
      REQUIRE((state++ % 100) == (c2 % 100));
  });
  auto c2C = tf2.emplace( [&](){ return (++c2 < 100) ? 0 : 1; });

  c2A.precede(c2B);
  c2B.precede(c2C);
  c2C.precede(c2B);
  c2A.name("c2A");
  c2B.name("c2B");
  c2C.name("c2C");

  auto init = tf3.emplace([&](){
    c1=c2=c2_repeat=0;
  }).name("init");

  auto loop1 = tf3.emplace([&](){
    return (++c2 < 100) ? 0 : 1;
  }).name("loop1");

  auto loop2 = tf3.emplace([&](){
    c2 = 0;
    return ++c2_repeat < 100 ? 0 : 1;
  }).name("loop2");

  auto sync = tf3.emplace([&](){
    REQUIRE(c2==0);
    REQUIRE(c2_repeat==100);
    c2_repeat = 0;
  }).name("sync");

  auto grab = tf3.emplace([&](){
    REQUIRE(c1 == 100);
    REQUIRE(c2 == 0);
    REQUIRE(c2_repeat == 0);
  }).name("grab");

  auto mod0 = tf3.composed_of(tf0).name("module0");
  auto mod1 = tf3.composed_of(tf1).name("module1");
  auto sbf1 = tf3.emplace([&](tf::Subflow& sbf){
    auto sbf1_1 = sbf.emplace([](){}).name("sbf1_1");
    auto module1 = sbf.composed_of(tf1).name("module1");
    auto sbf1_2 = sbf.emplace([](){}).name("sbf1_2");
    sbf1_1.precede(module1);
    module1.precede(sbf1_2);
    sbf.join();
  }).name("sbf1");
  auto mod2 = tf3.composed_of(tf2).name("module2");

  init.precede(mod0, sbf1, loop1);
  loop1.precede(loop1, mod2);
  loop2.succeed(mod2).precede(loop1, sync);
  mod0.precede(grab);
  sbf1.precede(mod1);
  mod1.precede(grab);
  sync.precede(grab);

  executor.run(tf3);
  executor.run_n(tf3, 10);
  executor.wait_for_all();

  //tf3.dump(std::cout);
}